

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexMathFpu.cpp
# Opt level: O2

void Iex_3_4::handleExceptionsSetInRegisters(void)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  undefined8 uStack_10;
  
  if ((anonymous_namespace)::fpeHandler == (code *)0x0) {
    return;
  }
  uVar1 = FpuControl::getExceptionMask();
  uVar2 = FpuControl::getExceptions();
  if ((uVar2 & 4) == 0 || (char)((uVar1 & 4) >> 2) != '\0') {
    if ((uVar2 & 8) == 0 || (char)((uVar1 & 8) >> 3) != '\0') {
      if ((uVar2 & 0x10) == 0 || (char)((uVar1 & 0x10) >> 4) != '\0') {
        if ((uVar2 & 0x20) == 0 || (char)((uVar1 & 0x20) >> 5) != '\0') {
          if ((uVar2 & 1) == 0 || (uVar1 & 1) != 0) {
            return;
          }
          pcVar3 = "Invalid floating-point operation.";
          uStack_10 = 0x10;
        }
        else {
          pcVar3 = "Inexact floating-point result.";
          uStack_10 = 8;
        }
      }
      else {
        pcVar3 = "Floating-point underflow.";
        uStack_10 = 2;
      }
    }
    else {
      pcVar3 = "Floating-point overflow.";
      uStack_10 = 1;
    }
  }
  else {
    pcVar3 = "Floating-point division by zero.";
    uStack_10 = 4;
  }
  (*(anonymous_namespace)::fpeHandler)(uStack_10,pcVar3);
  return;
}

Assistant:

void
handleExceptionsSetInRegisters ()
{
    if (fpeHandler == 0) return;

    int mask = FpuControl::getExceptionMask ();

    int exc = FpuControl::getExceptions ();

    if (!(mask & FpuControl::DIVZERO_EXC) && (exc & FpuControl::DIVZERO_EXC))
    {
        fpeHandler (IEEE_DIVZERO, "Floating-point division by zero.");
        return;
    }

    if (!(mask & FpuControl::OVERFLOW_EXC) && (exc & FpuControl::OVERFLOW_EXC))
    {
        fpeHandler (IEEE_OVERFLOW, "Floating-point overflow.");
        return;
    }

    if (!(mask & FpuControl::UNDERFLOW_EXC) &&
        (exc & FpuControl::UNDERFLOW_EXC))
    {
        fpeHandler (IEEE_UNDERFLOW, "Floating-point underflow.");
        return;
    }

    if (!(mask & FpuControl::INEXACT_EXC) && (exc & FpuControl::INEXACT_EXC))
    {
        fpeHandler (IEEE_INEXACT, "Inexact floating-point result.");
        return;
    }

    if (!(mask & FpuControl::INVALID_EXC) && (exc & FpuControl::INVALID_EXC))
    {
        fpeHandler (IEEE_INVALID, "Invalid floating-point operation.");
        return;
    }
}